

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void cloudSupport(CloudManager *dd,CloudNode *n,int *support)

{
  int *support_local;
  CloudNode *n_local;
  CloudManager *dd_local;
  
  if (((n->v & 0xefffffff) != 0xfffffff) && ((n->v & 0x10000000) == 0)) {
    n->v = n->v | 0x10000000;
    support[n->v] = 1;
    cloudSupport(dd,n->t,support);
    cloudSupport(dd,(CloudNode *)((ulong)n->e & 0xfffffffffffffffe),support);
  }
  return;
}

Assistant:

static void cloudSupport( CloudManager * dd, CloudNode * n, int * support )
{
    if ( cloudIsConstant(n) || cloudNodeIsMarked(n) )
        return;
    // set visited flag
    cloudNodeMark(n);
    support[cloudV(n)] = 1;
    cloudSupport( dd, cloudT(n), support );
    cloudSupport( dd, Cloud_Regular(cloudE(n)), support );
}